

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall stateObservation::tools::Logger::clearLogs(Logger *this)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::clear((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)&p_Var1[1]._M_parent);
  }
  return;
}

Assistant:

void Logger::clearLogs()
{
  for(std::map<const void *, log_s>::iterator i = logs_.begin(); i != logs_.end(); ++i)
  {
    i->second.array.clear();
  }
}